

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall
ExprTest_EqualLogicalConstant_Test::TestBody(ExprTest_EqualLogicalConstant_Test *this)

{
  ExprFactory *this_00;
  Expr EVar1;
  bool bVar2;
  LogicalConstant LVar3;
  char *in_R9;
  AssertHelper AStack_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  string local_48;
  AssertionResult gtest_ar_;
  
  EVar1.super_ExprBase.impl_ = (ExprBase)(this->super_ExprTest).l0.super_ExprBase.impl_;
  this_00 = &(this->super_ExprTest).factory_;
  LVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,false);
  gtest_ar_.success_ =
       mp::Equal(EVar1,(Expr)LVar3.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                             super_ExprBase.impl_);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,
               (AssertionResult *)"Equal(l0, factory_.MakeLogicalConstant(false))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x358
               ,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  EVar1.super_ExprBase.impl_ = (ExprBase)(this->super_ExprTest).l0.super_ExprBase.impl_;
  LVar3 = mp::BasicExprFactory<std::allocator<char>_>::MakeLogicalConstant(this_00,true);
  bVar2 = mp::Equal(EVar1,(Expr)LVar3.super_BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)48>.
                                super_ExprBase.impl_);
  gtest_ar_.success_ = !bVar2;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_48,(internal *)&gtest_ar_,
               (AssertionResult *)"Equal(l0, factory_.MakeLogicalConstant(true))","true","false",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x359
               ,local_48._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&AStack_58);
    std::__cxx11::string::~string((string *)&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  return;
}

Assistant:

TEST_F(ExprTest, EqualLogicalConstant) {
  EXPECT_TRUE(Equal(l0, factory_.MakeLogicalConstant(false)));
  EXPECT_FALSE(Equal(l0, factory_.MakeLogicalConstant(true)));
}